

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_subcommand_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  bool bVar1;
  allocator<char> local_269;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream out;
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  App::get_display_name_abi_cxx11_(&local_1e8,sub,true);
  bVar1 = sub->required_;
  if (bVar1 == true) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"REQUIRED",&local_269)
    ;
    FormatterBase::get_label(&local_268,&this->super_FormatterBase,&local_208);
    ::std::operator+(&local_248," ",&local_268);
  }
  else {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"",(allocator<char> *)&local_268);
  }
  ::std::operator+(&local_1c8,&local_1e8,&local_248);
  ::std::__cxx11::string::string((string *)&local_228,&sub->description_);
  detail::format_help(local_198,&local_1c8,&local_228,(this->super_FormatterBase).column_width_);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_248);
  if (bVar1 != false) {
    ::std::__cxx11::string::~string((string *)&local_268);
    ::std::__cxx11::string::~string((string *)&local_208);
  }
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out,
                        sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : ""),
                        sub->get_description(),
                        column_width_);
    return out.str();
}